

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::runQueryUniform
          (ExplicitUniformLocationCaseBase *this,CompiledProgram *program,Uniform *uniform,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *usedLocations,
          GLint max)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  int iVar1;
  GLuint GVar2;
  LayoutSpecifierBase *this_00;
  bool bVar3;
  Logger LVar4;
  bool bVar5;
  _Rb_tree_color _Var6;
  _Rb_tree_color _Var7;
  uint uVar8;
  pointer puVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  _Rb_tree_color _Var12;
  _Base_ptr p_Var13;
  pointer pUVar14;
  GLint expected;
  ulong uVar15;
  long lVar16;
  byte bVar17;
  ostringstream name;
  ulong local_3d0;
  long *local_3c0;
  long local_3b8;
  long local_3b0 [2];
  ulong local_3a0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_398;
  ExplicitUniformLocationCaseBase *local_390;
  LayoutSpecifierBase *local_388;
  GLint local_380;
  GLint local_37c;
  _Base_ptr local_378;
  undefined1 local_370 [8];
  ostream local_368;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_398 = &usedLocations->_M_t;
  if ((uniform->type).baseType == 0) {
    pUVar14 = (uniform->childUniforms).
              super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((uniform->childUniforms).
        super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
        ._M_impl.super__Vector_impl_data._M_finish != pUVar14) {
      lVar16 = 0;
      local_3d0 = 0;
      uVar15 = 0;
      local_390 = this;
      do {
        uVar11 = runQueryUniform(local_390,program,
                                 (Uniform *)((long)&(pUVar14->type).enumType + lVar16),
                                 (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)local_398,max);
        local_3d0 = local_3d0 | uVar11;
        uVar15 = uVar15 + 1;
        pUVar14 = (uniform->childUniforms).
                  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar16 = lVar16 + 0x1d8;
      } while (uVar15 < (ulong)(((long)(uniform->childUniforms).
                                       super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar14 >>
                                3) * -0x34115b1e5f75270d));
      return local_3d0;
    }
  }
  else {
    local_3a0 = 0;
    local_37c = 0;
    if (0 < max) {
      local_37c = max;
    }
    if (0 < (uniform->type).arraySize) {
      local_388 = &(uniform->location).super_LayoutSpecifierBase;
      __x = &program->stages;
      local_390 = (ExplicitUniformLocationCaseBase *)
                  &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
      local_378 = &(usedLocations->_M_t)._M_impl.super__Rb_tree_header._M_header;
      local_3d0 = 0;
      local_380 = max;
      do {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1c0,__x);
        bVar3 = LayoutSpecifierBase::isImplicit(local_388,&local_1c0);
        if (local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1c0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        this_00 = local_388;
        uVar8 = (uint)local_3a0;
        _Var12 = local_388->val + uVar8;
        if (bVar3) {
          _Var12 = ~_S_red;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1f0,__x);
        bVar3 = LayoutSpecifierBase::isImplicit(this_00,&local_1f0);
        if ((uVar8 < 1000) || (bVar3)) {
          if (local_1f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1f0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
LAB_00bbc8eb:
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(uniform->name)._M_dataplus._M_p,
                     (uniform->name)._M_string_length);
          UniformType::streamArrayStr(&uniform->type,(ostringstream *)local_1a8,(int)local_3a0);
          GVar2 = program->name;
          std::__cxx11::stringbuf::str();
          _Var6 = glu::CallLogWrapper::glGetUniformLocation
                            ((CallLogWrapper *)local_390,GVar2,
                             (GLchar *)CONCAT44(local_370._4_4_,local_370._0_4_));
          if ((undefined1 *)CONCAT44(local_370._4_4_,local_370._0_4_) != &local_368.field_0x8) {
            operator_delete((undefined1 *)CONCAT44(local_370._4_4_,local_370._0_4_),
                            local_368._8_8_ + 1);
          }
          GVar2 = program->name;
          std::__cxx11::stringbuf::str();
          _Var7 = glu::CallLogWrapper::glGetProgramResourceLocation
                            ((CallLogWrapper *)local_390,GVar2,0x92e1,
                             (GLchar *)CONCAT44(local_370._4_4_,local_370._0_4_));
          if ((undefined1 *)CONCAT44(local_370._4_4_,local_370._0_4_) != &local_368.field_0x8) {
            operator_delete((undefined1 *)CONCAT44(local_370._4_4_,local_370._0_4_),
                            local_368._8_8_ + 1);
          }
          if (_Var6 != _Var7) {
            local_370._0_4_ = local_370._0_4_ & 0xffffff00;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
            if (local_370[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_368,"Locations of  uniform \"",0x17);
            }
            std::__cxx11::stringbuf::str();
            if (local_370[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_368,(char *)local_3c0,local_3b8);
            }
            LVar4 = local_370[0];
            if (((byte)local_370[0] & 1) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_368,
                         "\" returned by glGetUniformLocation and differ glGetProgramResourceLocation differ: "
                         ,0x53);
              LVar4 = local_370[0];
            }
            if (((byte)LVar4 & 1) == 0) {
              std::ostream::operator<<(&local_368,_Var6);
              LVar4 = local_370[0];
            }
            if (((byte)LVar4 & 1) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>(&local_368," != ",4);
              LVar4 = local_370[0];
            }
            if (((byte)LVar4 & 1) == 0) {
              std::ostream::operator<<(&local_368,_Var7);
              LVar4 = local_370[0];
            }
            if (((byte)LVar4 & 1) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>(&local_368,".",1);
            }
            if (local_3c0 != local_3b0) {
              operator_delete(local_3c0,local_3b0[0] + 1);
            }
            Logger::~Logger((Logger *)local_370);
            local_3d0 = -1;
          }
          puVar9 = (program->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((program->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish == puVar9) {
            bVar17 = 0;
          }
          else {
            uVar15 = 0;
            bVar17 = 0;
            do {
              bVar3 = DefOccurence::occurs
                                ((DefOccurence *)(ulong)(uniform->declOccurence).occurence,
                                 puVar9[uVar15]);
              bVar5 = false;
              if (bVar3) {
                bVar5 = DefOccurence::occurs
                                  ((DefOccurence *)(ulong)(uniform->usageOccurence).occurence,
                                   (__x->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start[uVar15]);
              }
              bVar17 = bVar17 | bVar5;
              uVar15 = uVar15 + 1;
              puVar9 = (program->stages).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            } while (uVar15 < (ulong)((long)(program->stages).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)puVar9 >> 2));
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1d8,__x);
          bVar3 = LayoutSpecifierBase::isImplicit(local_388,&local_1d8);
          if (local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1d8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          _Var7 = _Var12;
          if (bVar3) {
            if ((bVar17 == 0) || (_Var7 = _Var6, -1 < (int)_Var6)) goto LAB_00bbcd63;
            local_370._0_4_ = (uint)(uint3)local_370._1_3_ << 8;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)local_370,(char (*) [21])"Unexpected uniform \"");
            std::__cxx11::stringbuf::str();
            if (local_370[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_368,(char *)local_3c0,local_3b8);
            }
            LVar4 = local_370[0];
            if (((byte)local_370[0] & 1) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_368,"\" location: expected positive value, got ",0x29);
              LVar4 = local_370[0];
            }
            if (((byte)LVar4 & 1) == 0) {
              std::ostream::operator<<(&local_368,_Var6);
              LVar4 = local_370[0];
            }
            if (((byte)LVar4 & 1) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>(&local_368,".",1);
            }
LAB_00bbce26:
            if (local_3c0 != local_3b0) {
              operator_delete(local_3c0,local_3b0[0] + 1);
            }
            Logger::~Logger((Logger *)local_370);
            local_3d0 = -1;
          }
          else {
            if ((_Var12 != _Var6) && (_Var6 != ~_S_red || bVar17 != 0)) {
              local_370._0_4_ = (uint)(uint3)local_370._1_3_ << 8;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)local_370,(char (*) [21])"Unexpected uniform \"");
              std::__cxx11::stringbuf::str();
              if (local_370[0] == (Logger)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          (&local_368,(char *)local_3c0,local_3b8);
              }
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)local_370,(char (*) [22])"\" location: expected ");
              if (local_370[0] == (Logger)0x0) {
                std::ostream::operator<<(&local_368,_Var12);
              }
              LVar4 = local_370[0];
              if (((byte)local_370[0] & 1) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>(&local_368,", got ",6);
                LVar4 = local_370[0];
              }
              if (((byte)LVar4 & 1) == 0) {
                std::ostream::operator<<(&local_368,_Var6);
                LVar4 = local_370[0];
              }
              if (((byte)LVar4 & 1) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>(&local_368,".",1);
              }
              if (local_3c0 != local_3b0) {
                operator_delete(local_3c0,local_3b0[0] + 1);
              }
              Logger::~Logger((Logger *)local_370);
              local_3d0 = -1;
            }
LAB_00bbcd63:
            _Var12 = _Var7;
            if (local_37c <= (int)_Var6) {
              local_370._0_4_ = local_370._0_4_ & 0xffffff00;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)local_370,(char (*) [10])0x1cb5bfa);
              std::__cxx11::stringbuf::str();
              if (local_370[0] == (Logger)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          (&local_368,(char *)local_3c0,local_3b8);
              }
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)local_370,(char (*) [22])"\" returned location (");
              if (local_370[0] == (Logger)0x0) {
                std::ostream::operator<<(&local_368,_Var6);
              }
              LVar4 = local_370[0];
              if (((byte)local_370[0] & 1) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          (&local_368,") is greater than implementation dependent limit (",0x32);
                LVar4 = local_370[0];
              }
              if (((byte)LVar4 & 1) == 0) {
                std::ostream::operator<<(&local_368,local_380);
              }
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)local_370,(char (*) [3])0x1c7281b);
              goto LAB_00bbce26;
            }
          }
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        else {
          iVar1 = (uniform->type).arraySize;
          if (local_1f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1f0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (iVar1 + -1000 < (int)local_3a0) goto LAB_00bbc8eb;
        }
        if (-1 < (int)_Var12) {
          p_Var10 = (((_Rep_type *)&local_398->_M_impl)->_M_impl).super__Rb_tree_header._M_header.
                    _M_parent;
          p_Var13 = local_378;
          if (p_Var10 != (_Base_ptr)0x0) {
            do {
              bVar3 = p_Var10[1]._M_color < _Var12;
              if (!bVar3) {
                p_Var13 = p_Var10;
              }
              p_Var10 = (&p_Var10->_M_left)[bVar3];
            } while (p_Var10 != (_Base_ptr)0x0);
            if ((p_Var13 != local_378) && (p_Var13[1]._M_color <= _Var12)) {
              local_370._0_4_ = local_370._0_4_ & 0xffffff00;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)local_370,(char (*) [19])"Uniform location (");
              if (local_370[0] == (Logger)0x0) {
                std::ostream::operator<<(&local_368,_Var12);
              }
              if (((byte)local_370[0] & 1) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          (&local_368,") is not unique.",0x10);
              }
              Logger::~Logger((Logger *)local_370);
              local_3d0 = -1;
            }
          }
          local_370._0_4_ = _Var12;
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_insert_unique<unsigned_int>(local_398,(uint *)local_370);
        }
        uVar8 = (int)local_3a0 + 1;
        local_3a0 = (ulong)uVar8;
        if ((uniform->type).arraySize <= (int)uVar8) {
          return local_3d0;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

long runQueryUniform(const CompiledProgram& program, const Uniform& uniform, std::set<GLuint>& usedLocations,
						 GLint max)
	{
		long ret = NO_ERROR;

		/*
		 glGetUniformLocation(program, name);
		 Query passes if returned value is unique in current program, matches
		 explicit location (if passed in GLSL code) and is less than value of
		 GL_MAX_UNIFORM_LOCATIONS.

		 glGetProgramResourceLocation(program, GL_UNIFIORM, name);
		 Query passes if returned value matches value returned from
		 glGetUniformLocation().
		 */

		if (uniform.type.isStruct())
		{
			for (size_t i = 0; i < uniform.childUniforms.size(); i++)
			{
				ret |= runQueryUniform(program, uniform.childUniforms[i], usedLocations, max);
			}
		}
		else
		{
			for (int arrayElem = 0; arrayElem < uniform.type.arraySize; arrayElem++)
			{

				/* Location that is taken by this uniform (even if not used).*/
				GLint reservedLocation = -1;
				if (!uniform.location.isImplicit(program.stages))
				{
					reservedLocation = uniform.location.val + arrayElem;
				}

				//optimization: for continuous arrays run queries at the beging and end only.
				bool runQueries = uniform.location.isImplicit(program.stages) ||
								  (arrayElem < 1000 || arrayElem > uniform.type.arraySize - 1000);

				if (runQueries)
				{
					std::ostringstream name;
					name << uniform.getName();
					uniform.type.streamArrayStr(name, arrayElem);
					GLint returned = glGetUniformLocation(program.name, name.str().c_str());

					GLint returnedPIQ = glGetProgramResourceLocation(program.name, GL_UNIFORM, name.str().c_str());

					if (returned != returnedPIQ)
					{
						ret |= ERROR;
						Logger()
							<< "Locations of  uniform \"" << name.str()
							<< "\" returned by glGetUniformLocation and differ glGetProgramResourceLocation differ: "
							<< returned << " != " << returnedPIQ << ".";
					}

					bool used = false;
					for (size_t i = 0; i < program.stages.size(); i++)
					{
						used |= uniform.declOccurence.occurs(program.stages[i]) &&
								uniform.usageOccurence.occurs(program.stages[i]);
					}

					if (!uniform.location.isImplicit(program.stages))
					{
						//Validate uniform location against explicit value
						GLint expected = reservedLocation;
						if (!(expected == returned || (!used && returned == -1)))
						{
							ret |= ERROR;
							Logger() << "Unexpected uniform \"" << name.str() << "\" location: expected " << expected
									 << ", got " << returned << ".";
						}
					}
					else
					{
						//Check if location > 0 if used;
						if (used)
						{
							if (returned < 0)
							{
								ret |= ERROR;
								Logger() << "Unexpected uniform \"" << name.str()
										 << "\" location: expected positive value, got " << returned << ".";
							}
							else
							{
								reservedLocation = returned;
							}
						}
					}

					if (returned >= 0)
					{
						//check if location is less than max

						if (returned >= max)
						{
							ret |= ERROR;
							Logger() << "Uniform \"" << name.str() << "\" returned location (" << returned
									 << ") is greater than implementation dependent limit (" << max << ").";
						}
					}
				} //if (runQueries)

				//usedLocations is always checked (even if queries were not run.
				if (reservedLocation >= 0)
				{
					//check if location is unique
					if (usedLocations.find(reservedLocation) != usedLocations.end())
					{
						ret |= ERROR;
						Logger() << "Uniform location (" << reservedLocation << ") is not unique.";
					}
					usedLocations.insert(reservedLocation);
				}
			}
		}
		return ret;
	}